

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication_p.h
# Opt level: O3

void QApplicationPrivate::initializeWidgetPalettesFromTheme(void)

{
  char *className;
  long *plVar1;
  QPalette *palette;
  long lVar2;
  
  plVar1 = QGuiApplicationPrivate::platform_theme;
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    QHash<QByteArray,_QPalette>::clear(&widgetPalettes);
    lVar2 = 8;
    do {
      className = *(char **)((long)&PTR_compressEvent_007e5758 + lVar2);
      palette = (QPalette *)
                (**(code **)(*plVar1 + 0x50))
                          (plVar1,*(undefined4 *)
                                   ((long)&initializeWidgetPalettesFromTheme::themedWidgets[0].
                                           className + lVar2));
      if (palette != (QPalette *)0x0) {
        QApplication::setPalette(palette,className);
      }
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0xf8);
  }
  return;
}

Assistant:

static QPlatformTheme *platformTheme()
    { return platform_theme; }